

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
CompilerContext::compile_conditions
          (CompilerContext *this,SyntaxTree *conds_node,shared_ptr<Label> *else_ptr)

{
  Command *pCVar1;
  unreachable_exception *this_00;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_00;
  size_t sStack_a0;
  allocator_type local_91;
  anon_class_8_1_8991fb9c compile_multi_andor;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_88;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_70;
  anon_union_48_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>_3
  local_58;
  undefined8 local_28;
  
  compile_multi_andor.this = this;
  switch(conds_node->type_) {
  case AND:
    sStack_a0 = 1;
    goto LAB_00195ecd;
  case OR:
    sStack_a0 = 0x15;
LAB_00195ecd:
    compile_conditions(SyntaxTree_const&,std::shared_ptr<Label>const&)::$_0::operator()
              (&compile_multi_andor,conds_node,sStack_a0);
    break;
  case IF:
  case ELSE:
  case WHILE:
  case REPEAT:
  case SWITCH:
  case CASE:
  case DEFAULT:
  case BREAK:
  case CONTINUE:
  case Decrement:
  case Increment:
  case Cast:
switchD_00195e14_caseD_19:
    this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
    unreachable_exception::unreachable_exception
              (this_00,
               "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(631)."
              );
    __cxa_throw(this_00,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
  default:
    if (conds_node->type_ != Command) goto switchD_00195e14_caseD_19;
  case NOT:
  case Equal:
  case Greater:
  case GreaterEqual:
  case Lesser:
  case LesserEqual:
    if ((this->program->opt).optimize_andor == false) {
      pCVar1 = std::experimental::optional<const_Command_&>::operator*(&this->commands->andor);
      local_58._target = '\0';
      local_28 = 2;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_58;
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::vector(&local_70,__l,&local_91);
      compile_command(this,pCVar1,&local_70,false);
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::~vector(&local_70);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                   *)&local_58._tail);
    }
    compile_condition(this,conds_node,false);
  }
  pCVar1 = std::experimental::optional<const_Command_&>::operator*(&this->commands->goto_if_false);
  eggs::variants::
  variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
  variant<std::shared_ptr<Label>const&,5ul,std::shared_ptr<Label>>
            ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
              *)&local_58._tail,else_ptr);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_58;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_88,__l_00,&local_91);
  compile_command(this,pCVar1,&local_88,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_88);
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
  ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
               *)&local_58._tail);
  return;
}

Assistant:

void CompilerContext::compile_conditions(const SyntaxTree& conds_node, const shared_ptr<Label>& else_ptr)
{
    auto compile_multi_andor = [this](const auto& conds_node, size_t op)
    {
        assert(conds_node.child_count() <= 8);
        compile_command(*this->commands.andor, { conv_int(op + conds_node.child_count() - 2) });
        for(auto& cond : conds_node) compile_condition(*cond);
    };

    switch(conds_node.type())
    {
        // single condition (also see compile_condition)
        case NodeType::NOT:
        case NodeType::Command:
        case NodeType::Equal:
        case NodeType::Greater:
        case NodeType::GreaterEqual:
        case NodeType::Lesser:
        case NodeType::LesserEqual:
            if (!this->program.opt.optimize_andor)
                compile_command(*this->commands.andor, { conv_int(0) });
            compile_condition(conds_node);
            break;
        case NodeType::AND: // 1-8
            compile_multi_andor(conds_node, 1);
            break;
        case NodeType::OR: // 21-28
            compile_multi_andor(conds_node, 21);
            break;
        default:
            Unreachable();
    }

    compile_command(*this->commands.goto_if_false, { else_ptr });
}